

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestPrettyPrinter.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_1c16ed::TestcaseBase::TestcaseBase(TestcaseBase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_type sVar3;
  ostringstream argsBufferStream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  string *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  (this->eventSource).id = 0x7b;
  (this->eventSource).severity = info;
  local_1b0 = &(this->eventSource).category;
  (this->eventSource).category._M_dataplus._M_p = (pointer)&(this->eventSource).category.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"cat","");
  (this->eventSource).function._M_dataplus._M_p = (pointer)&(this->eventSource).function.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&(this->eventSource).function,"func","")
  ;
  (this->eventSource).file._M_dataplus._M_p = (pointer)&(this->eventSource).file.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->eventSource).file,"dir1/dir2/file","");
  (this->eventSource).line = 0x1c8;
  (this->eventSource).formatString._M_dataplus._M_p =
       (pointer)&(this->eventSource).formatString.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->eventSource).formatString,"a: {}, b: {}","");
  (this->eventSource).argumentTags._M_dataplus._M_p =
       (pointer)&(this->eventSource).argumentTags.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->eventSource).argumentTags,"i[c","");
  (this->argsBuffer)._M_dataplus._M_p = (pointer)&(this->argsBuffer).field_2;
  (this->argsBuffer)._M_string_length = 0;
  (this->argsBuffer).field_2._M_local_buf[0] = '\0';
  (this->event).source = &this->eventSource;
  (this->event).clockValue = 0x5d935f81;
  (this->event).arguments._begin = (char *)0x0;
  (this->event).arguments._end = (char *)0x0;
  (this->writerProp).id = 0x315;
  (this->writerProp).name._M_dataplus._M_p = (pointer)&(this->writerProp).name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&(this->writerProp).name,"writer","");
  (this->writerProp).batchSize = 0;
  (this->clockSync).clockValue = 0;
  (this->clockSync).clockFrequency = 1;
  (this->clockSync).nsSinceEpoch = 0;
  (this->clockSync).tzOffset = 0x1518;
  (this->clockSync).tzName._M_dataplus._M_p = (pointer)&(this->clockSync).tzName.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&(this->clockSync).tzName,"XYZ","");
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  local_1d0._M_dataplus._M_p._0_4_ = 0x6f;
  std::ostream::write((char *)local_1a8,(long)&local_1d0);
  paVar1 = &local_1d0.field_2;
  local_1d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"foo","");
  mserialize::detail::BuiltinSerializer<std::__cxx11::string,void>::
  serialize<std::__cxx11::ostringstream>
            (&local_1d0,
             (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->argsBuffer,(string *)&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (this->argsBuffer)._M_dataplus._M_p;
  sVar3 = (this->argsBuffer)._M_string_length;
  (this->event).arguments._begin = pcVar2;
  (this->event).arguments._end = pcVar2 + sVar3;
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

TestcaseBase()
  {
    std::ostringstream argsBufferStream;
    mserialize::serialize(111, argsBufferStream);
    mserialize::serialize(std::string("foo"), argsBufferStream);
    argsBuffer = argsBufferStream.str();
    event.arguments = binlog::Range(argsBuffer.data(), argsBuffer.data() + argsBuffer.size());
  }